

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall node::calc(node *this,int id,double X,double Y,double Z)

{
  int iVar1;
  vec3 *pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar3 = X * X + Y * Y;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar4 = atan2(Z * 6378137.0,dVar3 * 6356752.3142);
  dVar5 = sin(dVar4);
  dVar4 = cos(dVar4);
  dVar4 = atan((dVar5 * 42841.311603977185 * dVar5 * dVar5 + Z) /
               (dVar4 * -42697.67270717997 * dVar4 * dVar4 + dVar3));
  dVar5 = atan2(Y,X);
  dVar6 = sin(dVar4);
  dVar6 = dVar6 * -0.0066943799901413165 * dVar6 + 1.0;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar7 = cos(dVar4);
  pvVar2 = points_wgs84;
  iVar1 = this->id;
  points_wgs84[iVar1].field_0.x = (float)dVar5;
  pvVar2[iVar1].field_1.y = (float)dVar4;
  pvVar2[iVar1].field_2.z = (float)(dVar3 / dVar7 + -6378137.0 / dVar6);
  return;
}

Assistant:

void node::calc(int id, double X, double Y, double Z){
    double _radiusEquator = 6378137;
    double _radiusPolar =  6356752.3142;
    double f = 1/298.257223563;
    double _eccentricitySquared = 2*f - pow(f,2);
    double p = sqrt(X*X + Y*Y);

    double theta = atan2(Z*_radiusEquator , (p*_radiusPolar));

    double eDashSquared = (_radiusEquator*_radiusEquator - _radiusPolar*_radiusPolar)/
                          (_radiusPolar*_radiusPolar);


    double sin_theta = sin(theta);

    double cos_theta = cos(theta);


    double latitude = atan( (Z + eDashSquared*_radiusPolar*sin_theta*sin_theta*sin_theta) /
                            (p - _eccentricitySquared*_radiusEquator*cos_theta*cos_theta*cos_theta) );

    double longitude = atan2(Y,X);


    double sin_latitude = sin(latitude);

    double N = _radiusEquator / sqrt( 1.0 - _eccentricitySquared*sin_latitude*sin_latitude);


    double height = p/cos(latitude) - N;
//    points->replace(id,QVector3D(latitude,longitude,height));
    //DoSomething
    points_wgs84[this->id] = glm::vec3(longitude,latitude,height);
}